

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void qlist_donext(t_qlist *x,int drop,int automatic)

{
  uint uVar1;
  t_atomtype tVar2;
  t_atomtype *ptVar3;
  int iVar4;
  t_atom *ptVar5;
  t_atom *ptVar6;
  int iVar7;
  ulong uVar8;
  t_symbol *s;
  int iVar9;
  int iVar10;
  _class **x_00;
  float fVar11;
  double dVar12;
  
  if (x->x_innext != 0) {
    pd_error(x,"qlist sent \'next\' from within itself");
    return;
  }
  x->x_innext = 1;
  iVar4 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  uVar1 = x->x_onset;
  uVar8 = (ulong)uVar1;
  ptVar5 = binbuf_getvec((x->x_textbuf).b_binbuf);
  if ((int)uVar1 < iVar4) {
    ptVar5 = ptVar5 + (int)uVar1;
    x_00 = (_class **)0x0;
    ptVar6 = ptVar5;
    do {
      while( true ) {
        ptVar6 = ptVar6 + 1;
        tVar2 = ptVar5->a_type;
        iVar7 = (int)uVar8;
        if ((tVar2 & ~A_FLOAT) != A_SEMI) break;
        if (tVar2 == A_SEMI) {
          x_00 = (_class **)0x0;
        }
        uVar8 = (ulong)(iVar7 + 1U);
        ptVar5 = ptVar5 + 1;
        if (iVar4 <= (int)(iVar7 + 1U)) goto LAB_0018eb6f;
      }
      if (tVar2 == A_FLOAT && x_00 == (_class **)0x0) {
        iVar9 = 1;
        goto LAB_0018eba4;
      }
      iVar9 = iVar7 + 1;
      iVar10 = iVar9;
      for (ptVar6 = ptVar5 + 1; (iVar9 < iVar4 && (iVar10 = iVar9, ptVar6->a_type - A_FLOAT < 2));
          ptVar6 = ptVar6 + 1) {
        iVar9 = iVar9 + 1;
        iVar10 = iVar4;
      }
      iVar7 = iVar10 - iVar7;
      x->x_onset = iVar10;
      if (x_00 == (_class **)0x0) {
        if (tVar2 == A_SYMBOL) {
          x_00 = ((ptVar5->a_w).w_symbol)->s_thing;
          if (x_00 != (_class **)0x0) {
            iVar7 = iVar7 + -1;
            ptVar5 = ptVar5 + 1;
            if (iVar7 != 0) goto LAB_0018eac9;
            goto LAB_0018eb40;
          }
          pd_error(x,"qlist: %s: no such object",((ptVar5->a_w).w_symbol)->s_name);
        }
        x_00 = (_class **)0x0;
      }
      else {
LAB_0018eac9:
        iVar4 = x->x_rewound;
        x->x_rewound = 0;
        if (drop == 0) {
          if (ptVar5->a_type == A_SYMBOL) {
            s = (ptVar5->a_w).w_symbol;
            iVar7 = iVar7 + -1;
            ptVar5 = ptVar5 + 1;
          }
          else {
            if (ptVar5->a_type != A_FLOAT) goto LAB_0018eb24;
            s = &s_list;
          }
          pd_typedmess(x_00,s,iVar7,ptVar5);
          if (x->x_rewound != 0) goto LAB_0018ebfa;
        }
LAB_0018eb24:
        x->x_rewound = iVar4;
      }
LAB_0018eb40:
      iVar4 = binbuf_getnatom((x->x_textbuf).b_binbuf);
      iVar7 = x->x_onset;
      uVar8 = (ulong)iVar7;
      ptVar5 = binbuf_getvec((x->x_textbuf).b_binbuf);
      ptVar5 = ptVar5 + uVar8;
      ptVar6 = ptVar5;
    } while (iVar7 < iVar4);
  }
LAB_0018eb6f:
  x->x_onset = 0x7fffffff;
  x->x_whenclockset = 0.0;
  x->x_innext = 0;
  outlet_bang(x->x_bangout);
  return;
  while( true ) {
    ptVar3 = &ptVar6->a_type;
    ptVar6 = ptVar6 + 1;
    iVar9 = iVar10 + 1;
    if (*ptVar3 != A_FLOAT) break;
LAB_0018eba4:
    iVar10 = iVar9;
    if (iVar4 <= iVar10 + iVar7) break;
  }
  x->x_onset = iVar10 + iVar7;
  if (automatic == 0) {
    outlet_list((x->x_textbuf).b_ob.te_outlet,(t_symbol *)0x0,iVar10,ptVar5);
  }
  else {
    fVar11 = (ptVar5->a_w).w_float * x->x_tempo;
    x->x_clockdelay = fVar11;
    clock_delay(x->x_clock,(double)fVar11);
    dVar12 = clock_getsystime();
    x->x_whenclockset = dVar12;
  }
LAB_0018ebfa:
  x->x_innext = 0;
  return;
}

Assistant:

static void qlist_donext(t_qlist *x, int drop, int automatic)
{
    t_pd *target = 0;
    if (x->x_innext)
    {
        pd_error(x, "qlist sent 'next' from within itself");
        return;
    }
    x->x_innext = 1;
    while (1)
    {
        int argc = binbuf_getnatom(x->x_binbuf),
            count, onset = x->x_onset, onset2, wasrewound;
        t_atom *argv = binbuf_getvec(x->x_binbuf);
        t_atom *ap = argv + onset, *ap2;
        if (onset >= argc) goto end;
        while (ap->a_type == A_SEMI || ap->a_type == A_COMMA)
        {
            if (ap->a_type == A_SEMI) target = 0;
            onset++, ap++;
            if (onset >= argc) goto end;
        }

        if (!target && ap->a_type == A_FLOAT)
        {
            ap2 = ap + 1;
            onset2 = onset + 1;
            while (onset2 < argc && ap2->a_type == A_FLOAT)
                onset2++, ap2++;
            x->x_onset = onset2;
            if (automatic)
            {
                clock_delay(x->x_clock,
                    x->x_clockdelay = ap->a_w.w_float * x->x_tempo);
                x->x_whenclockset = clock_getsystime();
            }
            else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
            x->x_innext = 0;
            return;
        }
        ap2 = ap + 1;
        onset2 = onset + 1;
        while (onset2 < argc &&
            (ap2->a_type == A_FLOAT || ap2->a_type == A_SYMBOL))
                onset2++, ap2++;
        x->x_onset = onset2;
        count = onset2 - onset;
        if (!target)
        {
            if (ap->a_type != A_SYMBOL) continue;
            else if (!(target = ap->a_w.w_symbol->s_thing))
            {
                pd_error(x, "qlist: %s: no such object",
                    ap->a_w.w_symbol->s_name);
                continue;
            }
            ap++;
            onset++;
            count--;
            if (!count)
            {
                x->x_onset = onset2;
                continue;
            }
        }
        wasrewound = x->x_rewound;
        x->x_rewound = 0;
        if (!drop)
        {
            if (ap->a_type == A_FLOAT)
                typedmess(target, &s_list, count, ap);
            else if (ap->a_type == A_SYMBOL)
                typedmess(target, ap->a_w.w_symbol, count-1, ap+1);
        }
        if (x->x_rewound)
        {
            x->x_innext = 0;
            return;
        }
        x->x_rewound = wasrewound;
    }  /* while (1); never falls through */

end:
    x->x_onset = 0x7fffffff;
    x->x_whenclockset = 0;
    x->x_innext = 0;
    outlet_bang(x->x_bangout);
}